

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreImporter.cpp
# Opt level: O0

void __thiscall
Assimp::Ogre::OgreImporter::InternReadFile
          (OgreImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  IOSystem *pIVar1;
  aiScene *paVar2;
  bool bVar3;
  IOStream *pIVar4;
  DeadlyImportError *this_00;
  Mesh *__p;
  pointer pMVar5;
  CIrrXML_IOStreamReader *this_01;
  pointer _stream;
  pointer callback;
  IrrXMLReader *__p_00;
  pointer reader_00;
  MeshXml *__p_01;
  pointer pMVar6;
  unique_ptr<Assimp::Ogre::MeshXml,_std::default_delete<Assimp::Ogre::MeshXml>_> local_118;
  unique_ptr<Assimp::Ogre::MeshXml,_std::default_delete<Assimp::Ogre::MeshXml>_> mesh_1;
  unique_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_std::default_delete<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>_>_>
  reader_1;
  unique_ptr<Assimp::CIrrXML_IOStreamReader,_std::default_delete<Assimp::CIrrXML_IOStreamReader>_>
  xmlStream;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> scopedFile;
  unique_ptr<Assimp::Ogre::Mesh,_std::default_delete<Assimp::Ogre::Mesh>_> mesh;
  MemoryStreamReader reader;
  string local_b0;
  undefined1 local_89;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  allocator<char> local_51;
  string local_50;
  IOStream *local_30;
  IOStream *f;
  IOSystem *pIOHandler_local;
  aiScene *pScene_local;
  string *pFile_local;
  OgreImporter *this_local;
  
  f = (IOStream *)pIOHandler;
  pIOHandler_local = (IOSystem *)pScene;
  pScene_local = (aiScene *)pFile;
  pFile_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"rb",&local_51);
  pIVar4 = IOSystem::Open(pIOHandler,pFile,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  paVar2 = pScene_local;
  local_30 = pIVar4;
  if (pIVar4 == (IOStream *)0x0) {
    local_89 = 1;
    this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::operator+(&local_88,"Failed to open file ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pScene_local
                  );
    DeadlyImportError::DeadlyImportError(this_00,&local_88);
    local_89 = 0;
    __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,".mesh",(allocator<char> *)&reader.field_0x37);
  bVar3 = EndsWith((string *)paVar2,&local_b0,false);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&reader.field_0x37);
  if (bVar3) {
    StreamReader<false,_false>::StreamReader((StreamReader<false,_false> *)&mesh,local_30,false);
    __p = OgreBinarySerializer::ImportMesh((StreamReader<false,_false> *)&mesh);
    std::unique_ptr<Assimp::Ogre::Mesh,std::default_delete<Assimp::Ogre::Mesh>>::
    unique_ptr<std::default_delete<Assimp::Ogre::Mesh>,void>
              ((unique_ptr<Assimp::Ogre::Mesh,std::default_delete<Assimp::Ogre::Mesh>> *)&scopedFile
               ,__p);
    pIVar4 = f;
    pMVar5 = std::unique_ptr<Assimp::Ogre::Mesh,_std::default_delete<Assimp::Ogre::Mesh>_>::get
                       ((unique_ptr<Assimp::Ogre::Mesh,_std::default_delete<Assimp::Ogre::Mesh>_> *)
                        &scopedFile);
    OgreBinarySerializer::ImportSkeleton((IOSystem *)pIVar4,pMVar5);
    paVar2 = pScene_local;
    pIVar1 = pIOHandler_local;
    pIVar4 = f;
    pMVar5 = std::unique_ptr<Assimp::Ogre::Mesh,_std::default_delete<Assimp::Ogre::Mesh>_>::get
                       ((unique_ptr<Assimp::Ogre::Mesh,_std::default_delete<Assimp::Ogre::Mesh>_> *)
                        &scopedFile);
    ReadMaterials(this,(string *)paVar2,(IOSystem *)pIVar4,(aiScene *)pIVar1,pMVar5);
    pMVar5 = std::unique_ptr<Assimp::Ogre::Mesh,_std::default_delete<Assimp::Ogre::Mesh>_>::
             operator->((unique_ptr<Assimp::Ogre::Mesh,_std::default_delete<Assimp::Ogre::Mesh>_> *)
                        &scopedFile);
    Ogre::Mesh::ConvertToAssimpScene(pMVar5,(aiScene *)pIOHandler_local);
    std::unique_ptr<Assimp::Ogre::Mesh,_std::default_delete<Assimp::Ogre::Mesh>_>::~unique_ptr
              ((unique_ptr<Assimp::Ogre::Mesh,_std::default_delete<Assimp::Ogre::Mesh>_> *)
               &scopedFile);
    StreamReader<false,_false>::~StreamReader((StreamReader<false,_false> *)&mesh);
  }
  else {
    std::unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>>::
    unique_ptr<std::default_delete<Assimp::IOStream>,void>
              ((unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>> *)&xmlStream,
               local_30);
    this_01 = (CIrrXML_IOStreamReader *)operator_new(0x30);
    _stream = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::get
                        ((unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> *)
                         &xmlStream);
    CIrrXML_IOStreamReader::CIrrXML_IOStreamReader(this_01,_stream);
    std::
    unique_ptr<Assimp::CIrrXML_IOStreamReader,std::default_delete<Assimp::CIrrXML_IOStreamReader>>::
    unique_ptr<std::default_delete<Assimp::CIrrXML_IOStreamReader>,void>
              ((unique_ptr<Assimp::CIrrXML_IOStreamReader,std::default_delete<Assimp::CIrrXML_IOStreamReader>>
                *)&reader_1,this_01);
    callback = std::
               unique_ptr<Assimp::CIrrXML_IOStreamReader,_std::default_delete<Assimp::CIrrXML_IOStreamReader>_>
               ::get((unique_ptr<Assimp::CIrrXML_IOStreamReader,_std::default_delete<Assimp::CIrrXML_IOStreamReader>_>
                      *)&reader_1);
    __p_00 = irr::io::createIrrXMLReader(&callback->super_IFileReadCallBack);
    std::
    unique_ptr<irr::io::IIrrXMLReader<char,irr::io::IXMLBase>,std::default_delete<irr::io::IIrrXMLReader<char,irr::io::IXMLBase>>>
    ::unique_ptr<std::default_delete<irr::io::IIrrXMLReader<char,irr::io::IXMLBase>>,void>
              ((unique_ptr<irr::io::IIrrXMLReader<char,irr::io::IXMLBase>,std::default_delete<irr::io::IIrrXMLReader<char,irr::io::IXMLBase>>>
                *)&mesh_1,__p_00);
    reader_00 = std::
                unique_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_std::default_delete<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>_>_>
                ::get((unique_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_std::default_delete<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>_>_>
                       *)&mesh_1);
    __p_01 = OgreXmlSerializer::ImportMesh(reader_00);
    std::unique_ptr<Assimp::Ogre::MeshXml,std::default_delete<Assimp::Ogre::MeshXml>>::
    unique_ptr<std::default_delete<Assimp::Ogre::MeshXml>,void>
              ((unique_ptr<Assimp::Ogre::MeshXml,std::default_delete<Assimp::Ogre::MeshXml>> *)
               &local_118,__p_01);
    pIVar4 = f;
    pMVar6 = std::unique_ptr<Assimp::Ogre::MeshXml,_std::default_delete<Assimp::Ogre::MeshXml>_>::
             get(&local_118);
    OgreXmlSerializer::ImportSkeleton((IOSystem *)pIVar4,pMVar6);
    paVar2 = pScene_local;
    pIVar1 = pIOHandler_local;
    pIVar4 = f;
    pMVar6 = std::unique_ptr<Assimp::Ogre::MeshXml,_std::default_delete<Assimp::Ogre::MeshXml>_>::
             get(&local_118);
    ReadMaterials(this,(string *)paVar2,(IOSystem *)pIVar4,(aiScene *)pIVar1,pMVar6);
    pMVar6 = std::unique_ptr<Assimp::Ogre::MeshXml,_std::default_delete<Assimp::Ogre::MeshXml>_>::
             operator->(&local_118);
    MeshXml::ConvertToAssimpScene(pMVar6,(aiScene *)pIOHandler_local);
    std::unique_ptr<Assimp::Ogre::MeshXml,_std::default_delete<Assimp::Ogre::MeshXml>_>::~unique_ptr
              (&local_118);
    std::
    unique_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_std::default_delete<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>_>_>
    ::~unique_ptr((unique_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_std::default_delete<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>_>_>
                   *)&mesh_1);
    std::
    unique_ptr<Assimp::CIrrXML_IOStreamReader,_std::default_delete<Assimp::CIrrXML_IOStreamReader>_>
    ::~unique_ptr((unique_ptr<Assimp::CIrrXML_IOStreamReader,_std::default_delete<Assimp::CIrrXML_IOStreamReader>_>
                   *)&reader_1);
    std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::~unique_ptr
              ((unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> *)&xmlStream);
  }
  return;
}

Assistant:

void OgreImporter::InternReadFile(const std::string &pFile, aiScene *pScene, Assimp::IOSystem *pIOHandler)
{
    // Open source file
    IOStream *f = pIOHandler->Open(pFile, "rb");
    if (!f) {
        throw DeadlyImportError("Failed to open file " + pFile);
    }

    // Binary .mesh import
    if (EndsWith(pFile, ".mesh", false))
    {
        /// @note MemoryStreamReader takes ownership of f.
        MemoryStreamReader reader(f);

        // Import mesh
        std::unique_ptr<Mesh> mesh(OgreBinarySerializer::ImportMesh(&reader));

        // Import skeleton
        OgreBinarySerializer::ImportSkeleton(pIOHandler, mesh.get());

        // Import mesh referenced materials
        ReadMaterials(pFile, pIOHandler, pScene, mesh.get());

        // Convert to Assimp
        mesh->ConvertToAssimpScene(pScene);
    }
    // XML .mesh.xml import
    else
    {
        /// @note XmlReader does not take ownership of f, hence the scoped ptr.
        std::unique_ptr<IOStream> scopedFile(f);
        std::unique_ptr<CIrrXML_IOStreamReader> xmlStream(new CIrrXML_IOStreamReader(scopedFile.get()));
        std::unique_ptr<XmlReader> reader(irr::io::createIrrXMLReader(xmlStream.get()));

        // Import mesh
        std::unique_ptr<MeshXml> mesh(OgreXmlSerializer::ImportMesh(reader.get()));

        // Import skeleton
        OgreXmlSerializer::ImportSkeleton(pIOHandler, mesh.get());

        // Import mesh referenced materials
        ReadMaterials(pFile, pIOHandler, pScene, mesh.get());

        // Convert to Assimp
        mesh->ConvertToAssimpScene(pScene);
    }
}